

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

void P_NewChaseDir(AActor *actor)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TObjPtr<AActor> *this;
  AActor *pAVar5;
  AActor *pAVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool local_212;
  bool local_211;
  bool local_1a9;
  TVector2<double> local_1a8;
  double local_198;
  double dist;
  bool ismeleeattacker;
  AActor *pAStack_188;
  AActor *target;
  undefined1 local_178 [48];
  TVector2<double> local_148;
  DAngle angle;
  TVector2<double> local_120;
  double local_110;
  double back;
  TVector2<double> local_f0;
  double local_e0;
  double front;
  double deltay;
  double deltax;
  line_t_conflict *line;
  FBlockLinesIterator it;
  FBoundingBox box;
  TFlags<ActorFlag2,_unsigned_int> local_68;
  TFlags<ActorFlag,_unsigned_int> local_64;
  TVector2<double> local_60;
  TFlags<ActorFlag4,_unsigned_int> local_50;
  TFlags<ActorFlag6,_unsigned_int> local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [20];
  TFlags<ActorFlag5,_unsigned_int> local_24;
  undefined1 local_20 [8];
  DVector2 delta;
  AActor *actor_local;
  
  delta.Y = (double)actor;
  TVector2<double>::TVector2((TVector2<double> *)local_20);
  *(undefined2 *)((long)delta.Y + 0x204) = 0;
  TFlags<ActorFlag5,_unsigned_int>::operator&
            (&local_24,
             SUB84(delta.Y,0) +
             (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24);
  if (uVar3 == 0) {
    this = (TObjPtr<AActor> *)((long)delta.Y + 0x2c8);
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)delta.Y + 0x208));
    bVar2 = TObjPtr<AActor>::operator==(this,pAVar5);
    local_1a9 = false;
    if (bVar2) goto LAB_0054eb9d;
  }
  else {
LAB_0054eb9d:
    local_1a9 = TObjPtr<AActor>::operator!=
                          ((TObjPtr<AActor> *)((long)delta.Y + 0x2c8),(AActor *)0x0);
  }
  dVar7 = delta.Y;
  if (local_1a9 != false) {
    TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)delta.Y + 0x2c8));
    AActor::Vec2To((AActor *)local_38,(AActor *)dVar7);
    TVector2<double>::operator=((TVector2<double> *)local_20,(TVector2<double> *)local_38);
    goto LAB_0054ed4e;
  }
  bVar2 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)((long)delta.Y + 0x208),(AActor *)0x0);
  dVar7 = delta.Y;
  if (!bVar2) {
    Printf("P_NewChaseDir: called with no target\n");
    P_RandomChaseDir((AActor *)delta.Y);
    return;
  }
  TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)delta.Y + 0x208));
  AActor::Vec2To((AActor *)local_48,(AActor *)dVar7);
  TVector2<double>::operator=((TVector2<double> *)local_20,(TVector2<double> *)local_48);
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_4c,
             SUB84(delta.Y,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
  if (uVar3 != 0) goto LAB_0054ed4e;
  pAVar5 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)((long)delta.Y + 0x208));
  if (pAVar5->player == (player_t *)0x0) {
LAB_0054ecd8:
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_50,
               SUB84(delta.Y,0) +
               (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
    bVar2 = uVar3 != 0;
  }
  else {
    pAVar5 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)((long)delta.Y + 0x208));
    bVar2 = true;
    if ((pAVar5->player->cheats & 0x400U) == 0) goto LAB_0054ecd8;
  }
  if (bVar2) {
    TVector2<double>::operator-(&local_60);
    TVector2<double>::operator=((TVector2<double> *)local_20,&local_60);
  }
LAB_0054ed4e:
  dVar7 = *(double *)((long)delta.Y + 0x140) - *(double *)((long)delta.Y + 0x150);
  bVar2 = false;
  if (*(double *)((long)delta.Y + 1000) <= dVar7 && dVar7 != *(double *)((long)delta.Y + 1000)) {
    dVar7 = AActor::Z((AActor *)delta.Y);
    bVar2 = false;
    if (dVar7 <= *(double *)((long)delta.Y + 0x140)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_64,
                 SUB84(delta.Y,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
      bVar2 = false;
      if (uVar3 == 0) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_68,SUB84(delta.Y,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_68);
        bVar2 = false;
        if (uVar3 == 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)((long)box.m_Box + 0x1c),
                     SUB84(delta.Y,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)box.m_Box + 0x1c));
          bVar2 = false;
          if (uVar3 == 0) {
            bVar2 = (i_compatflags & 0x4000U) == 0;
          }
        }
      }
    }
  }
  if (bVar2) {
    dVar7 = AActor::X((AActor *)delta.Y);
    dVar8 = AActor::Y((AActor *)delta.Y);
    FBoundingBox::FBoundingBox
              ((FBoundingBox *)&it.list,dVar7,dVar8,*(double *)((long)delta.Y + 0x178));
    FBlockLinesIterator::FBlockLinesIterator((FBlockLinesIterator *)&line,(FBoundingBox *)&it.list);
    deltay = 0.0;
    front = 0.0;
LAB_0054eece:
    deltax = (double)FBlockLinesIterator::Next((FBlockLinesIterator *)&line);
    if ((line_t_conflict *)deltax != (line_t_conflict *)0x0) {
      if (((((line_t_conflict *)deltax)->backsector != (sector_t_conflict *)0x0) &&
          (bVar2 = FBoundingBox::inRange((FBoundingBox *)&it.list,(line_t_conflict *)deltax), bVar2)
          ) && (iVar4 = FBoundingBox::BoxOnLineSide((FBoundingBox *)&it.list,(line_t *)deltax),
               iVar4 == -1)) {
        lVar1 = *(long *)((long)deltax + 0x78);
        AActor::PosRelative((DVector3 *)&back,(AActor *)delta.Y,(line_t_conflict *)deltax);
        TVector2<double>::TVector2(&local_f0,(TVector3<double> *)&back);
        local_e0 = secplane_t::ZatPoint((secplane_t *)(lVar1 + 0xb0),&local_f0);
        lVar1 = *(long *)((long)deltax + 0x80);
        AActor::PosRelative((DVector3 *)&angle,(AActor *)delta.Y,(line_t_conflict *)deltax);
        TVector2<double>::TVector2(&local_120,(TVector3<double> *)&angle);
        local_110 = secplane_t::ZatPoint((secplane_t *)(lVar1 + 0xb0),&local_120);
        TAngle<double>::TAngle((TAngle<double> *)&local_148.Y);
        dVar7 = local_110;
        dVar9 = AActor::Z((AActor *)delta.Y);
        dVar8 = local_e0;
        if (((dVar7 != dVar9) || (NAN(dVar7) || NAN(dVar9))) ||
           (dVar7 = AActor::Z((AActor *)delta.Y), dVar7 - *(double *)((long)delta.Y + 1000) <= dVar8
           )) {
          dVar8 = local_e0;
          dVar9 = AActor::Z((AActor *)delta.Y);
          dVar7 = local_110;
          if (((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) ||
             (dVar8 = AActor::Z((AActor *)delta.Y),
             dVar8 - *(double *)((long)delta.Y + 1000) <= dVar7)) goto LAB_0054eece;
          line_t::Delta((line_t *)local_178);
          TVector2<double>::Angle((TVector2<double> *)(local_178 + 0x10));
          TAngle<double>::operator+((TAngle<double> *)(local_178 + 0x18),180.0);
          TAngle<double>::operator=
                    ((TAngle<double> *)&local_148.Y,(TAngle<double> *)(local_178 + 0x18));
        }
        else {
          line_t::Delta((line_t *)(local_178 + 0x20));
          TVector2<double>::Angle(&local_148);
          TAngle<double>::operator=((TAngle<double> *)&local_148.Y,(TAngle<double> *)&local_148);
        }
        dVar7 = TAngle<double>::Sin((TAngle<double> *)&local_148.Y);
        deltay = deltay - dVar7 * 32.0;
        dVar7 = TAngle<double>::Cos((TAngle<double> *)&local_148.Y);
        front = dVar7 * 32.0 + front;
      }
      goto LAB_0054eece;
    }
    if ((((deltay != 0.0) || (NAN(deltay))) || (front != 0.0)) || (NAN(front))) {
      TFlags<ActorFlag5,_unsigned_int>::operator|=
                ((TFlags<ActorFlag5,_unsigned_int> *)((long)delta.Y + 0x1cc),MF5_AVOIDINGDROPOFF);
      P_DoNewChaseDir((AActor *)delta.Y,deltay,front);
      operator~((int)&target + MF5_NODROPOFF);
      TFlags<ActorFlag5,_unsigned_int>::operator&=
                ((TFlags<ActorFlag5,_unsigned_int> *)((long)delta.Y + 0x1cc),
                 (Self *)((long)&target + 4));
      *(undefined2 *)((long)delta.Y + 0x202) = 1;
      return;
    }
    deltax = 0.0;
  }
  pAStack_188 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)delta.Y + 0x208));
  if (((0 < pAStack_188->health) &&
      (bVar2 = AActor::IsFriend((AActor *)delta.Y,pAStack_188), pAVar5 = pAStack_188, !bVar2)) &&
     (pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)delta.Y + 0x2c8)),
     pAVar5 != pAVar6)) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&dist + 4),
               SUB84(delta.Y,0) + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG))
    ;
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&dist + 4));
    if (uVar3 != 0) {
      dist._3_1_ = 0;
      local_198 = AActor::Distance2D((AActor *)delta.Y,pAStack_188,false);
      if (pAStack_188->player == (player_t *)0x0) {
        local_211 = false;
        if (pAStack_188->MissileState == (FState *)0x0) {
          local_211 = local_198 < (pAStack_188->meleerange + pAStack_188->radius) * 2.0;
        }
        dist._3_1_ = local_211;
      }
      else if (pAStack_188->player->ReadyWeapon != (AWeapon *)0x0) {
        local_212 = (*(uint *)&(pAStack_188->player->ReadyWeapon->super_AStateProvider).
                               super_AInventory.field_0x4fc & 0x8000) != 0 && local_198 < 192.0;
        dist._3_1_ = local_212;
      }
      if ((dist._3_1_ & 1) != 0) {
        iVar4 = FRandom::operator()(&pr_enemystrafe);
        *(ushort *)((long)delta.Y + 0x204) = (ushort)iVar4 & 0xf;
        TVector2<double>::operator-(&local_1a8);
        TVector2<double>::operator=((TVector2<double> *)local_20,&local_1a8);
      }
    }
  }
  P_DoNewChaseDir((AActor *)delta.Y,(double)local_20,delta.X);
  if (*(short *)((long)delta.Y + 0x204) != 0) {
    *(undefined2 *)((long)delta.Y + 0x202) = *(undefined2 *)((long)delta.Y + 0x204);
  }
  return;
}

Assistant:

void P_NewChaseDir(AActor * actor)
{
	DVector2 delta;

	actor->strafecount = 0;

	if ((actor->flags5&MF5_CHASEGOAL || actor->goal == actor->target) && actor->goal!=NULL)
	{
		delta = actor->Vec2To(actor->goal);
	}
	else if (actor->target != NULL)
	{
		delta = actor->Vec2To(actor->target);

		if (!(actor->flags6 & MF6_NOFEAR))
		{
			if ((actor->target->player != NULL && (actor->target->player->cheats & CF_FRIGHTENING)) || 
				(actor->flags4 & MF4_FRIGHTENED))
			{
				delta = -delta;
			}
		}
	}
	else
	{
		// Don't abort if this happens.
		Printf ("P_NewChaseDir: called with no target\n");
		P_RandomChaseDir(actor);
		return;
	}
	
	// Try to move away from a dropoff
	if (actor->floorz - actor->dropoffz > actor->MaxDropOffHeight && 
		actor->Z() <= actor->floorz && !(actor->flags & MF_DROPOFF) && 
		!(actor->flags2 & MF2_ONMOBJ) &&
		!(actor->flags & MF_FLOAT) && !(i_compatflags & COMPATF_DROPOFF))
	{
		FBoundingBox box(actor->X(), actor->Y(), actor->radius);
		FBlockLinesIterator it(box);
		line_t *line;

		double deltax = 0;
		double deltay = 0;
		while ((line = it.Next()))
		{
			if (line->backsector  && // Ignore one-sided linedefs
				box.inRange(line) &&
				box.BoxOnLineSide(line) == -1)
		    {
				double front = line->frontsector->floorplane.ZatPoint(actor->PosRelative(line));
				double back  = line->backsector->floorplane.ZatPoint(actor->PosRelative(line));
				DAngle angle;
		
				// The monster must contact one of the two floors,
				// and the other must be a tall dropoff.
				
				if (back == actor->Z() && front < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle();   // front side dropoff
				}
				else if (front == actor->Z() && back < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle() + 180.; // back side dropoff
				}
				else continue;
		
				// Move away from dropoff at a standard speed.
				// Multiple contacted linedefs are cumulative (e.g. hanging over corner)
				deltax -= 32 * angle.Sin();
				deltay += 32 * angle.Cos();
			}
		}

		if (deltax != 0 || deltay != 0) 
		{
			// [Graf Zahl] I have changed P_TryMove to only apply this logic when
			// being called from here. AVOIDINGDROPOFF activates the code that
			// allows monsters to move away from a dropoff. This is different from
			// MBF which requires unconditional use of the altered logic and therefore
			// forcing a massive change in the monster behavior to use this.

			// use different dropoff movement logic in P_TryMove
			actor->flags5|=MF5_AVOIDINGDROPOFF;
			P_DoNewChaseDir(actor, deltax, deltay);
			actor->flags5&=~MF5_AVOIDINGDROPOFF;
		
			// If moving away from dropoff, set movecount to 1 so that 
			// small steps are taken to get monster away from dropoff.
			actor->movecount = 1;
			return;
		}
	}

#if 0
	// Move away from friends when too close, except
	// in certain situations (e.g. a crowded lift)

	// MBF code for friends. Cannot be done in ZDoom but left here as a reminder for later implementation.

	if (actor->flags & target->flags & MF_FRIEND &&
	    distfriend > dist && 
	    !P_IsOnLift(target) && !P_IsUnderDamage(actor))
	  deltax = -deltax, deltay = -deltay;
	else
#endif

	// MBF's monster_backing option. Made an actor flag instead. Also cleaned the code up to make it readable.
	// Todo: implement the movement logic
	AActor *target = actor->target;
	if (target->health > 0 && !actor->IsFriend(target) && target != actor->goal)
    {   // Live enemy target

		if (actor->flags3 & MF3_AVOIDMELEE)
		{
			bool ismeleeattacker = false;
			double dist = actor->Distance2D(target);
			if (target->player == NULL)
			{
				ismeleeattacker = (target->MissileState == NULL && dist < (target->meleerange + target->radius)*2);
			}
			else if (target->player->ReadyWeapon != NULL)
			{
				// melee range of player weapon is a parameter of the action function and cannot be checked here.
				// Add a new weapon property?
				ismeleeattacker = ((target->player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON) && dist < 192);
			}
			if (ismeleeattacker)
			{
				actor->strafecount = pr_enemystrafe() & 15;
				delta = -delta;
			}
	    }
	}

	P_DoNewChaseDir(actor, delta.X, delta.Y);

	// If strafing, set movecount to strafecount so that old Doom
	// logic still works the same, except in the strafing part

	if (actor->strafecount)
		actor->movecount = actor->strafecount;

}